

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O3

void __thiscall Diligent::DeviceContextGLImpl::EndSubpass(DeviceContextGLImpl *this)

{
  Uint32 srcX1;
  Uint32 srcY1;
  SubpassDesc *pSVar1;
  FramebufferGLImpl *pFVar2;
  uint uVar3;
  int iVar4;
  GLuint GVar5;
  uint uVar6;
  int iVar7;
  TextureFormatAttribs *pTVar8;
  undefined4 uVar9;
  char (*in_RCX) [37];
  ulong uVar10;
  long lVar11;
  RenderPassAttachmentDesc *pRVar12;
  int iVar13;
  int iVar14;
  RenderPassGLImpl *pRVar15;
  ulong uVar16;
  GLenum err;
  string msg;
  GLint glCurrReadFB;
  undefined4 uStack_5c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  pointer local_40;
  RenderPassGLImpl *local_38;
  
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.m_pObject ==
      (RenderPassGLImpl *)0x0) {
    FormatString<char[26],char[20]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pActiveRenderPass",
               (char (*) [20])in_RCX);
    in_RCX = (char (*) [37])0x221;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x221);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundFramebuffer.m_pObject ==
      (FramebufferGLImpl *)0x0) {
    FormatString<char[26],char[20]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pBoundFramebuffer",
               (char (*) [20])in_RCX);
    in_RCX = (char (*) [37])0x222;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x222);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pRVar15 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.
            m_pObject;
  uVar3 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex;
  if ((pRVar15->super_RenderPassBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
      .m_Desc.SubpassCount <= uVar3) {
    FormatString<char[26],char[37]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_SubpassIndex < RPDesc.SubpassCount",in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x224);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
    uVar3 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex;
  }
  pSVar1 = (pRVar15->super_RenderPassBase<Diligent::EngineGLImplTraits>).
           super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
           .m_Desc.pSubpasses;
  local_40 = (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundFramebuffer.
              m_pObject)->m_SubpassFramebuffers).
             super__Vector_base<Diligent::FramebufferGLImpl::SubpassFramebuffers,_std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar3;
  glCurrReadFB = 0;
  glGetIntegerv(0x8caa,&glCurrReadFB);
  err = glGetError();
  local_38 = pRVar15;
  if (err != 0) {
    LogError<false,char[39],char[17],unsigned_int>
              (false,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x22c,(char (*) [39])"Failed to get current read framebuffer",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&msg,(char (*) [6])0x8506c9);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x22c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pRVar15 = local_38;
  iVar4 = (local_40->RenderTarget).super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
          m_uiHandle;
  if (iVar4 == 0) {
    iVar4 = (**(code **)(*(long *)(this->m_pSwapChain).m_pObject + 0x60))();
  }
  if (glCurrReadFB != iVar4) {
    FormatString<char[28]>(&msg,(char (*) [28])"Unexpected read framebuffer");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x22e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (pSVar1[uVar3].pResolveAttachments != (AttachmentReference *)0x0) {
    GVar5 = (local_40->Resolve).super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
            m_uiHandle;
    if (GVar5 == 0) {
      GVar5 = (**(code **)(*(long *)(this->m_pSwapChain).m_pObject + 0x60))();
    }
    (*__glewBindFramebuffer)(0x8ca9,GVar5);
    glCurrReadFB = glGetError();
    if (glCurrReadFB != 0) {
      LogError<false,char[59],char[17],unsigned_int>
                (false,"EndSubpass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x23a,(char (*) [59])"Failed to bind resolve destination FBO as draw framebuffer",
                 (char (*) [17])"\nGL Error Code: ",(uint *)&glCurrReadFB);
      FormatString<char[6]>(&msg,(char (*) [6])0x8506c9);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"EndSubpass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x23a);
      pRVar15 = local_38;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        pRVar15 = local_38;
      }
    }
    pFVar2 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundFramebuffer.
             m_pObject;
    srcX1 = (pFVar2->super_FramebufferBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
            .m_Desc.Width;
    srcY1 = (pFVar2->super_FramebufferBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
            .m_Desc.Height;
    GLContextState::BlitFramebufferNoScissor
              (&this->m_ContextState,0,0,srcX1,srcY1,0,0,srcX1,srcY1,0x4000,0x2600);
  }
  if (__glewInvalidateFramebuffer == (PFNGLINVALIDATEFRAMEBUFFERPROC)0x0) goto LAB_003272d3;
  uVar6 = pSVar1[uVar3].RenderTargetAttachmentCount;
  if (uVar6 == 0) {
    iVar4 = 0;
  }
  else {
    uVar16 = 0;
    iVar4 = 0;
    do {
      uVar10 = (ulong)pSVar1[uVar3].pRenderTargetAttachments[uVar16].AttachmentIndex;
      if (((uVar10 != 0xffffffff) &&
          ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex ==
           (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.
            m_pObject)->super_RenderPassBase<Diligent::EngineGLImplTraits>).m_AttachmentFirstLastUse
           [uVar10].second)) &&
         ((pRVar15->super_RenderPassBase<Diligent::EngineGLImplTraits>).
          super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
          .m_Desc.pAttachments[uVar10].StoreOp == ATTACHMENT_STORE_OP_DISCARD)) {
        if ((local_40->RenderTarget).super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
            m_uiHandle == 0) {
          iVar14 = 0x1800;
          if (uVar16 != 0) {
            FormatString<char[58]>
                      ((string *)&glCurrReadFB,
                       (char (*) [58])"Default framebuffer can only have single color attachment");
            DebugAssertionFailed
                      ((Char *)CONCAT44(uStack_5c,glCurrReadFB),"EndSubpass",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                       ,0x256);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(uStack_5c,glCurrReadFB) != &local_50) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(uStack_5c,glCurrReadFB),local_50._M_allocated_capacity + 1
                             );
            }
            uVar6 = pSVar1[uVar3].RenderTargetAttachmentCount;
          }
        }
        else {
          iVar14 = (int)uVar16 + 0x8ce0;
        }
        lVar11 = (long)iVar4;
        iVar4 = iVar4 + 1;
        *(int *)((long)&msg._M_dataplus._M_p + lVar11 * 4) = iVar14;
        pRVar15 = local_38;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < uVar6);
  }
  iVar14 = iVar4;
  if (((pSVar1[uVar3].pDepthStencilAttachment != (AttachmentReference *)0x0) &&
      (uVar16 = (ulong)(pSVar1[uVar3].pDepthStencilAttachment)->AttachmentIndex,
      uVar16 != 0xffffffff)) &&
     ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex ==
      (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.m_pObject)
      ->super_RenderPassBase<Diligent::EngineGLImplTraits>).m_AttachmentFirstLastUse[uVar16].second)
     ) {
    pRVar12 = (pRVar15->super_RenderPassBase<Diligent::EngineGLImplTraits>).
              super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
              .m_Desc.pAttachments;
    if (pRVar12[uVar16].StoreOp == ATTACHMENT_STORE_OP_DISCARD) {
      pRVar12 = pRVar12 + uVar16;
      pTVar8 = GetTextureFormatAttribs(pRVar12->Format);
      if (1 < (byte)(pTVar8->ComponentType - COMPONENT_TYPE_DEPTH)) {
        FormatString<char[26],char[109]>
                  ((string *)&glCurrReadFB,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH || FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL"
                   ,(char (*) [109])pRVar12);
        DebugAssertionFailed
                  ((Char *)CONCAT44(uStack_5c,glCurrReadFB),"EndSubpass",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x26a);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_5c,glCurrReadFB) != &local_50) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_5c,glCurrReadFB),local_50._M_allocated_capacity + 1);
        }
      }
      if ((local_40->RenderTarget).super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
          m_uiHandle == 0) {
        iVar14 = iVar4 + 1;
        *(undefined4 *)((long)&msg._M_dataplus._M_p + (long)iVar4 * 4) = 0x1801;
        if (pTVar8->ComponentType != COMPONENT_TYPE_DEPTH_STENCIL) goto LAB_00327228;
        uVar9 = 0x1802;
        iVar13 = 2;
        iVar7 = iVar14;
      }
      else {
        uVar9 = 0x821a;
        if (pTVar8->ComponentType == COMPONENT_TYPE_DEPTH) {
          uVar9 = 0x8d00;
        }
        iVar13 = 1;
        iVar7 = iVar4;
      }
      iVar14 = iVar4 + iVar13;
      *(undefined4 *)((long)&msg._M_dataplus._M_p + (long)iVar7 * 4) = uVar9;
    }
  }
LAB_00327228:
  if (0 < iVar14) {
    (*__glewInvalidateFramebuffer)(0x8ca8,iVar14,(GLenum *)&msg);
    err = glGetError();
    if (err != 0) {
      LogError<false,char[33],char[17],unsigned_int>
                (false,"EndSubpass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x27c,(char (*) [33])"glInvalidateFramebuffer() failed",
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>((string *)&glCurrReadFB,(char (*) [6])0x8506c9);
      DebugAssertionFailed
                ((Char *)CONCAT44(uStack_5c,glCurrReadFB),"EndSubpass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x27c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(uStack_5c,glCurrReadFB) != &local_50) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(uStack_5c,glCurrReadFB),local_50._M_allocated_capacity + 1);
      }
    }
  }
LAB_003272d3:
  (this->m_ContextState).m_FBOId = -1;
  return;
}

Assistant:

void DeviceContextGLImpl::EndSubpass()
{
    VERIFY_EXPR(m_pActiveRenderPass);
    VERIFY_EXPR(m_pBoundFramebuffer);
    const RenderPassDesc& RPDesc = m_pActiveRenderPass->GetDesc();
    VERIFY_EXPR(m_SubpassIndex < RPDesc.SubpassCount);
    const SubpassDesc& SubpassDesc = RPDesc.pSubpasses[m_SubpassIndex];

    const FramebufferGLImpl::SubpassFramebuffers& SubpassFBOs = m_pBoundFramebuffer->GetSubpassFramebuffer(m_SubpassIndex);
#ifdef DILIGENT_DEBUG
    {
        GLint glCurrReadFB = 0;
        glGetIntegerv(GL_READ_FRAMEBUFFER_BINDING, &glCurrReadFB);
        DEV_CHECK_GL_ERROR("Failed to get current read framebuffer");
        GLuint glExpectedReadFB = SubpassFBOs.RenderTarget != 0 ? static_cast<GLuint>(SubpassFBOs.RenderTarget) : m_pSwapChain->GetDefaultFBO();
        VERIFY(static_cast<GLuint>(glCurrReadFB) == glExpectedReadFB, "Unexpected read framebuffer");
    }
#endif

    if (SubpassDesc.pResolveAttachments != nullptr)
    {
        GLuint ResolveDstFBO = SubpassFBOs.Resolve;
        if (ResolveDstFBO == 0)
        {
            ResolveDstFBO = m_pSwapChain.RawPtr<ISwapChainGL>()->GetDefaultFBO();
        }
        glBindFramebuffer(GL_DRAW_FRAMEBUFFER, ResolveDstFBO);
        DEV_CHECK_GL_ERROR("Failed to bind resolve destination FBO as draw framebuffer");

        const FramebufferDesc& FBODesc = m_pBoundFramebuffer->GetDesc();
        m_ContextState.BlitFramebufferNoScissor(
            0, 0, static_cast<GLint>(FBODesc.Width), static_cast<GLint>(FBODesc.Height),
            0, 0, static_cast<GLint>(FBODesc.Width), static_cast<GLint>(FBODesc.Height),
            GL_COLOR_BUFFER_BIT,
            GL_NEAREST // Filter is ignored
        );
    }

    if (glInvalidateFramebuffer != nullptr)
    {
        // It is crucially important to invalidate the framebuffer while it is bound
        // https://community.arm.com/developer/tools-software/graphics/b/blog/posts/mali-performance-2-how-to-correctly-handle-framebuffers
        GLsizei InvalidateAttachmentsCount = 0;

        std::array<GLenum, MAX_RENDER_TARGETS + 1> InvalidateAttachments;
        for (Uint32 rt = 0; rt < SubpassDesc.RenderTargetAttachmentCount; ++rt)
        {
            const Uint32 RTAttachmentIdx = SubpassDesc.pRenderTargetAttachments[rt].AttachmentIndex;
            if (RTAttachmentIdx != ATTACHMENT_UNUSED)
            {
                auto AttachmentLastUse = m_pActiveRenderPass->GetAttachmentFirstLastUse(RTAttachmentIdx).second;
                if (AttachmentLastUse == m_SubpassIndex && RPDesc.pAttachments[RTAttachmentIdx].StoreOp == ATTACHMENT_STORE_OP_DISCARD)
                {
                    if (SubpassFBOs.RenderTarget == 0)
                    {
                        VERIFY(rt == 0, "Default framebuffer can only have single color attachment");
                        InvalidateAttachments[InvalidateAttachmentsCount++] = GL_COLOR;
                    }
                    else
                    {
                        InvalidateAttachments[InvalidateAttachmentsCount++] = GL_COLOR_ATTACHMENT0 + rt;
                    }
                }
            }
        }

        if (SubpassDesc.pDepthStencilAttachment != nullptr)
        {
            const Uint32 DSAttachmentIdx = SubpassDesc.pDepthStencilAttachment->AttachmentIndex;
            if (DSAttachmentIdx != ATTACHMENT_UNUSED)
            {
                auto AttachmentLastUse = m_pActiveRenderPass->GetAttachmentFirstLastUse(DSAttachmentIdx).second;
                if (AttachmentLastUse == m_SubpassIndex && RPDesc.pAttachments[DSAttachmentIdx].StoreOp == ATTACHMENT_STORE_OP_DISCARD)
                {
                    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(RPDesc.pAttachments[DSAttachmentIdx].Format);
                    VERIFY_EXPR(FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH || FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL);
                    if (SubpassFBOs.RenderTarget == 0)
                    {
                        InvalidateAttachments[InvalidateAttachmentsCount++] = GL_DEPTH;
                        if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
                            InvalidateAttachments[InvalidateAttachmentsCount++] = GL_STENCIL;
                    }
                    else
                    {
                        InvalidateAttachments[InvalidateAttachmentsCount++] = FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH ? GL_DEPTH_ATTACHMENT : GL_DEPTH_STENCIL_ATTACHMENT;
                    }
                }
            }
        }

        if (InvalidateAttachmentsCount > 0)
        {
            glInvalidateFramebuffer(GL_READ_FRAMEBUFFER, InvalidateAttachmentsCount, InvalidateAttachments.data());
            DEV_CHECK_GL_ERROR("glInvalidateFramebuffer() failed");
        }
    }

    // TODO: invalidate input attachments using glInvalidateTexImage

    m_ContextState.InvalidateFBO();
}